

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O0

void __thiscall
jbcoin::STObject::setFieldUsingSetValue<jbcoin::STInteger<unsigned_long>,unsigned_long>
          (STObject *this,SField *field,unsigned_long value)

{
  int iVar1;
  STInteger<unsigned_long> *local_48;
  STInteger<unsigned_long> *cf;
  STBase *rf;
  unsigned_long value_local;
  SField *field_local;
  STObject *this_local;
  
  cf = (STInteger<unsigned_long> *)getPField(this,field,true);
  if (cf == (STInteger<unsigned_long> *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*(cf->super_STBase)._vptr_STBase[4])();
  if (iVar1 == 0) {
    cf = (STInteger<unsigned_long> *)makeFieldPresent(this,field);
  }
  if (cf == (STInteger<unsigned_long> *)0x0) {
    local_48 = (STInteger<unsigned_long> *)0x0;
  }
  else {
    local_48 = (STInteger<unsigned_long> *)
               __dynamic_cast(cf,&STBase::typeinfo,&STInteger<unsigned_long>::typeinfo,0);
  }
  if (local_48 == (STInteger<unsigned_long> *)0x0) {
    Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
  }
  STInteger<unsigned_long>::setValue(local_48,value);
  return;
}

Assistant:

void setFieldUsingSetValue (SField const& field, V value)
    {
        static_assert(!std::is_lvalue_reference<V>::value, "");

        STBase* rf = getPField (field, true);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        if (rf->getSType () == STI_NOTPRESENT)
            rf = makeFieldPresent (field);

        T* cf = dynamic_cast<T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        cf->setValue (std::move (value));
    }